

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_nonblock.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  uint uVar3;
  int __fd;
  int iVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  ssize_t nread;
  char mem [24576];
  long lStack_90;
  int spin;
  libssh2_struct_stat_size total;
  long time_ms;
  timeval end;
  timeval start;
  LIBSSH2_SFTP_HANDLE *sftp_handle;
  LIBSSH2_SFTP *sftp_session;
  LIBSSH2_SESSION *session;
  int rc;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\x01';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  sftp_session = (LIBSSH2_SFTP *)0x0;
  lStack_90 = 0;
  mem[0x5ffc] = '\0';
  mem[0x5ffd] = '\0';
  mem[0x5ffe] = '\0';
  mem[0x5fff] = '\0';
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    sftppath = argv[4];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_4_ = i;
    iVar4 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    if (iVar4 == 0) {
      sftp_session = (LIBSSH2_SFTP *)libssh2_session_init_ex(0,0,0);
      if (sftp_session == (LIBSSH2_SFTP *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        libssh2_session_set_blocking(sftp_session,0);
        gettimeofday((timeval *)&end.tv_usec,(__timezone_ptr_t)0x0);
        do {
          uVar3 = libssh2_session_handshake(sftp_session,__fd);
        } while (uVar3 == 0xffffffdb);
        if (uVar3 == 0) {
          lVar5 = libssh2_hostkey_hash(sftp_session,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          if (sin.sin_zero._0_4_ == 0) {
            do {
              pcVar1 = username;
              sVar6 = strlen(username);
              iVar4 = libssh2_userauth_publickey_fromfile_ex
                                (sftp_session,pcVar1,sVar6 & 0xffffffff,pubkey,privkey,password);
            } while (iVar4 == -0x25);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by public key failed.\n");
              goto LAB_0010193e;
            }
          }
          else {
            do {
              pcVar1 = username;
              sVar6 = strlen(username);
              pcVar2 = password;
              sVar7 = strlen(password);
              iVar4 = libssh2_userauth_password_ex
                                (sftp_session,pcVar1,sVar6 & 0xffffffff,pcVar2,sVar7 & 0xffffffff,0)
              ;
            } while (iVar4 == -0x25);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by password failed.\n");
              goto LAB_0010193e;
            }
          }
          fprintf(_stderr,"libssh2_sftp_init().\n");
          do {
            lVar5 = libssh2_sftp_init(sftp_session);
            if (lVar5 == 0) {
              iVar4 = libssh2_session_last_errno(sftp_session);
              if (iVar4 != -0x25) {
                fprintf(_stderr,"Unable to init SFTP session\n");
                goto LAB_0010193e;
              }
              fprintf(_stderr,"non-blocking init\n");
              waitsocket(__fd,(LIBSSH2_SESSION *)sftp_session);
            }
          } while (lVar5 == 0);
          fprintf(_stderr,"libssh2_sftp_open().\n");
          do {
            pcVar1 = sftppath;
            sVar6 = strlen(sftppath);
            lVar8 = libssh2_sftp_open_ex(lVar5,pcVar1,sVar6 & 0xffffffff,1,0,0);
            if (lVar8 == 0) {
              iVar4 = libssh2_session_last_errno(sftp_session);
              __stream = _stderr;
              if (iVar4 != -0x25) {
                uVar9 = libssh2_sftp_last_error(lVar5);
                fprintf(__stream,"Unable to open file with SFTP: %ld\n",uVar9);
                goto LAB_0010193e;
              }
              fprintf(_stderr,"non-blocking open\n");
              waitsocket(__fd,(LIBSSH2_SESSION *)sftp_session);
            }
          } while (lVar8 == 0);
          fprintf(_stderr,"libssh2_sftp_open() is done, now receive data.\n");
          while( true ) {
            while (sVar6 = libssh2_sftp_read(lVar8,&nread,0x6000), sVar6 == 0xffffffffffffffdb) {
              mem._24572_4_ = mem._24572_4_ + 1;
              waitsocket(__fd,(LIBSSH2_SESSION *)sftp_session);
            }
            if ((long)sVar6 < 1) break;
            lStack_90 = sVar6 + lStack_90;
            write(1,&nread,sVar6);
          }
          gettimeofday((timeval *)&time_ms,(__timezone_ptr_t)0x0);
          lVar10 = tvdiff(_time_ms,stack0xffffffffffffff90);
          fprintf(_stderr,"Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
                  (double)lStack_90 / ((double)lVar10 / 1000.0),lStack_90,lVar10,
                  (ulong)(uint)mem._24572_4_);
          libssh2_sftp_close_handle(lVar8);
          libssh2_sftp_shutdown(lVar5);
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
LAB_0010193e:
  if (sftp_session != (LIBSSH2_SFTP *)0x0) {
    fprintf(_stderr,"libssh2_session_disconnect\n");
    do {
      iVar4 = libssh2_session_disconnect_ex(sftp_session,0xb,"Normal Shutdown","");
    } while (iVar4 == -0x25);
    libssh2_session_free(sftp_session);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
#ifdef HAVE_GETTIMEOFDAY
    struct timeval start;
    struct timeval end;
    long time_ms;
#endif
    libssh2_struct_stat_size total = 0;
    int spin = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&start, NULL);
#endif

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc =
              libssh2_userauth_publickey_fromfile(session, username,
                                                  pubkey, privkey,
                                                  password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }
#if 0
    libssh2_trace(session, LIBSSH2_TRACE_CONN);
#endif
    fprintf(stderr, "libssh2_sftp_init().\n");
    do {
        sftp_session = libssh2_sftp_init(session);

        if(!sftp_session) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN) {
                fprintf(stderr, "non-blocking init\n");
                waitsocket(sock, session); /* now we wait */
            }
            else {
                fprintf(stderr, "Unable to init SFTP session\n");
                goto shutdown;
            }
        }
    } while(!sftp_session);

    fprintf(stderr, "libssh2_sftp_open().\n");
    /* Request a file via SFTP */
    do {
        sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                        LIBSSH2_FXF_READ, 0);
        if(!sftp_handle) {
            if(libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                        libssh2_sftp_last_error(sftp_session));
                goto shutdown;
            }
            else {
                fprintf(stderr, "non-blocking open\n");
                waitsocket(sock, session); /* now we wait */
            }
        }
    } while(!sftp_handle);

    fprintf(stderr, "libssh2_sftp_open() is done, now receive data.\n");
    do {
        char mem[1024 * 24];
        ssize_t nread;

        /* loop until we fail */
        while((nread = libssh2_sftp_read(sftp_handle, mem, sizeof(mem))) ==
              LIBSSH2_ERROR_EAGAIN) {
            spin++;
            waitsocket(sock, session); /* now we wait */
        }
        if(nread > 0) {
            total += nread;
            write(1, mem, (size_t)nread);
        }
        else {
            break;
        }
    } while(1);

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&end, NULL);
    time_ms = tvdiff(end, start);
    fprintf(stderr, "Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
            (long)total, time_ms,
            (double)total / ((double)time_ms / 1000.0), spin);
#else
    fprintf(stderr, "Got %ld bytes spin: %d\n", (long)total, spin);
#endif

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        fprintf(stderr, "libssh2_session_disconnect\n");
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}